

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_rle.c
# Opt level: O3

uint64_t internal_rle_compress(void *out,uint64_t outbytes,void *src,uint64_t srcbytes)

{
  char cVar1;
  char cVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  
  pcVar6 = (char *)(srcbytes + (long)src);
  pcVar8 = (char *)0x0;
  pcVar10 = (char *)src;
LAB_00105109:
  if (pcVar6 <= src) {
    return (uint64_t)pcVar8;
  }
  pcVar10 = pcVar10 + 1;
  if (pcVar6 <= pcVar10) {
    lVar11 = 0;
LAB_00105160:
    bVar4 = (byte)lVar11;
    if (pcVar10 < pcVar6) {
      lVar11 = 0;
      do {
        pcVar9 = pcVar10 + lVar11;
        cVar2 = (char)lVar11;
        cVar1 = bVar4 + cVar2;
        pcVar7 = pcVar10 + lVar11 + 1;
        if (((pcVar7 < pcVar6) && (*pcVar9 == pcVar9[1])) && (pcVar10 + lVar11 + 2 < pcVar6)) {
          bVar12 = *pcVar9 == pcVar10[lVar11 + 2];
          bVar13 = cVar1 == '~';
          if ((bVar13 || bVar12) || (pcVar6 <= pcVar7)) goto LAB_0010522d;
        }
        else if ((cVar1 == '~') || (pcVar6 <= pcVar7)) {
          pcVar10 = pcVar7;
          if (cVar1 == '~') {
            pcVar10 = pcVar9;
          }
          bVar4 = bVar4 + cVar2 + 1;
          if ('}' < (char)bVar4) {
            bVar4 = 0x7e;
          }
          break;
        }
        lVar11 = lVar11 + 1;
      } while( true );
    }
    goto LAB_001051e1;
  }
  lVar11 = 0;
  do {
    if ((*src != pcVar10[lVar11]) || ((char)lVar11 == '\x7f')) break;
    lVar3 = lVar11 + 1;
    lVar11 = lVar11 + 1;
  } while (pcVar10 + lVar3 < pcVar6);
  pcVar10 = pcVar10 + lVar11;
  if ((byte)lVar11 < 2) goto LAB_00105160;
  *(byte *)((long)out + (long)pcVar8) = (byte)lVar11;
  *(char *)((long)out + (long)(pcVar8 + 1)) = *src;
  pcVar9 = pcVar8 + 2;
  src = pcVar10;
  goto LAB_00105219;
LAB_0010522d:
  bVar5 = bVar4 + cVar2;
  pcVar10 = pcVar7;
  if (bVar13 || bVar12) {
    pcVar10 = pcVar9;
  }
  bVar4 = bVar5 + 1;
  if (bVar13 || bVar12) {
    bVar4 = bVar5;
  }
LAB_001051e1:
  *(byte *)((long)out + (long)pcVar8) = ~bVar4;
  pcVar9 = pcVar8 + 1;
  if (src < pcVar10) {
    pcVar9 = pcVar10 + ((long)pcVar9 - (long)src);
    lVar11 = 0;
    do {
      *(char *)((long)out + (long)(pcVar8 + lVar11 + 1)) = *(char *)((long)src + lVar11);
      lVar11 = lVar11 + 1;
    } while ((long)pcVar10 - (long)src != lVar11);
    src = (void *)((long)src + lVar11);
  }
LAB_00105219:
  pcVar8 = pcVar9;
  if (outbytes <= pcVar9) {
    return (uint64_t)pcVar9;
  }
  goto LAB_00105109;
}

Assistant:

uint64_t
internal_rle_compress (
    void* out, uint64_t outbytes, const void* src, uint64_t srcbytes)
{
    int8_t*       cbuf = out;
    const int8_t* runs = src;
    const int8_t* end  = runs + srcbytes;
    const int8_t* rune = runs + 1;
    uint64_t      outb = 0;

    while (runs < end)
    {
        uint8_t curcount = 0;
        while (rune < end && *runs == *rune && curcount < MAX_RUN_LENGTH)
        {
            ++rune;
            ++curcount;
        }

        if (curcount >= (MIN_RUN_LENGTH - 1))
        {
            cbuf[outb++] = (int8_t) curcount;
            cbuf[outb++] = *runs;

            runs = rune;
        }
        else
        {
            /* incompressible */
            ++curcount;
            while (rune < end &&
                   ((rune + 1 >= end || *rune != *(rune + 1)) ||
                    (rune + 2 >= end || *(rune + 1) != *(rune + 2))) &&
                   curcount < MAX_RUN_LENGTH)
            {
                ++curcount;
                ++rune;
            }
            cbuf[outb++] = (int8_t) (-((int) curcount));
            while (runs < rune)
                cbuf[outb++] = *runs++;
        }
        ++rune;
        if (outb >= outbytes) break;
    }
    return outb;
}